

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_ldst_ldapr_stlr(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  bool bVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  uint size;
  uint iss_srt;
  _Bool local_3d;
  _Bool local_3c;
  _Bool local_38;
  
  if ((s->isar->id_aa64isar1 & 0xe00000) == 0) {
LAB_006a0b22:
    unallocated_encoding_aarch64(s);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  size = insn >> 0x1e;
  switch(insn >> 0x16 & 3) {
  case 0:
    bVar1 = true;
    break;
  case 1:
    bVar1 = false;
    break;
  case 2:
    if (size == 3) goto LAB_006a0b22;
    local_38 = false;
    goto LAB_006a0b04;
  case 3:
    local_38 = true;
    if ((int)insn < 0) goto LAB_006a0b22;
LAB_006a0b04:
    local_3d = (insn >> 0x16 & 1) == 0;
    local_3c = true;
    bVar1 = false;
    goto LAB_006a0b56;
  }
  local_3d = size == 3;
  local_38 = false;
  local_3c = false;
LAB_006a0b56:
  iss_srt = insn & 0x1f;
  pTVar2 = read_cpu_reg_sp_aarch64(s,insn >> 5 & 0x1f,1);
  tcg_gen_addi_i64_aarch64(tcg_ctx,pTVar2,pTVar2,(long)((int)(insn << 0xb) >> 0x17));
  pTVar2 = clean_data_tbi(s,pTVar2);
  if (bVar1) {
    tcg_gen_mb_aarch64(tcg_ctx,TCG_BAR_STRL|TCG_MO_ALL);
    pTVar3 = cpu_reg_aarch64(s,iss_srt);
    do_gpr_st_memidx(s,pTVar3,pTVar2,size,s->mmu_idx & 0xf,true,iss_srt,local_3d,true);
    return;
  }
  pTVar3 = cpu_reg_aarch64(s,iss_srt);
  do_gpr_ld_memidx(s,pTVar3,pTVar2,size,local_3c,local_38,s->mmu_idx & 0xf,true,iss_srt,local_3d,
                   true);
  tcg_gen_mb_aarch64(tcg_ctx,TCG_BAR_LDAQ|TCG_MO_ALL);
  return;
}

Assistant:

static void disas_ldst_ldapr_stlr(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rt = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int offset = sextract32(insn, 12, 9);
    int opc = extract32(insn, 22, 2);
    int size = extract32(insn, 30, 2);
    TCGv_i64 clean_addr, dirty_addr;
    bool is_store = false;
    bool is_signed = false;
    bool extend = false;
    bool iss_sf;

    if (!dc_isar_feature(aa64_rcpc_8_4, s)) {
        unallocated_encoding(s);
        return;
    }

    switch (opc) {
    case 0: /* STLURB */
        is_store = true;
        break;
    case 1: /* LDAPUR* */
        break;
    case 2: /* LDAPURS* 64-bit variant */
        if (size == 3) {
            unallocated_encoding(s);
            return;
        }
        is_signed = true;
        break;
    case 3: /* LDAPURS* 32-bit variant */
        if (size > 1) {
            unallocated_encoding(s);
            return;
        }
        is_signed = true;
        extend = true; /* zero-extend 32->64 after signed load */
        break;
    default:
        g_assert_not_reached();
    }

    iss_sf = disas_ldst_compute_iss_sf(size, is_signed, opc);

    if (rn == 31) {
        gen_check_sp_alignment(s);
    }

    dirty_addr = read_cpu_reg_sp(s, rn, 1);
    tcg_gen_addi_i64(tcg_ctx, dirty_addr, dirty_addr, offset);
    clean_addr = clean_data_tbi(s, dirty_addr);

    if (is_store) {
        /* Store-Release semantics */
        tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_STRL);
        do_gpr_st(s, cpu_reg(s, rt), clean_addr, size, true, rt, iss_sf, true);
    } else {
        /*
         * Load-AcquirePC semantics; we implement as the slightly more
         * restrictive Load-Acquire.
         */
        do_gpr_ld(s, cpu_reg(s, rt), clean_addr, size, is_signed, extend,
                  true, rt, iss_sf, true);
        tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_LDAQ);
    }
}